

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strljustify_s.c
# Opt level: O0

errno_t strljustify_s(char *dest,rsize_t dmax)

{
  long lVar1;
  char *pcVar2;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  rsize_t orig_dmax;
  char *orig_dest;
  errno_t in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_c = 400;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_c = 0x191;
  }
  else if (in_RSI < 0x10000001) {
    if ((*in_RDI == '\0') || (local_20 = in_RSI, local_18 = in_RDI, in_RSI < 2)) {
      *in_RDI = '\0';
      local_c = 0;
    }
    else {
      for (; pcVar2 = in_RDI, *local_18 != '\0'; local_18 = local_18 + 1) {
        if (local_20 == 0) goto LAB_0010b54f;
        local_20 = local_20 - 1;
      }
      while( true ) {
        local_18 = pcVar2;
        bVar3 = true;
        if (*local_18 != ' ') {
          bVar3 = *local_18 == '\t';
        }
        if (!bVar3) break;
        pcVar2 = local_18 + 1;
      }
      if ((in_RDI != local_18) && (*local_18 != '\0')) {
        while (*local_18 != '\0') {
          *in_RDI = *local_18;
          *local_18 = ' ';
          in_RDI = in_RDI + 1;
          local_18 = local_18 + 1;
        }
        *in_RDI = '\0';
      }
      local_c = 0;
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_c = 0x193;
  }
LAB_0010b669:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
LAB_0010b54f:
  for (; in_RSI != 0; in_RSI = in_RSI - 1) {
    *in_RDI = '\0';
    in_RDI = in_RDI + 1;
  }
  invoke_safe_str_constraint_handler(in_RDI,(void *)0x0,in_stack_ffffffffffffffcc);
  local_c = 0x197;
  goto LAB_0010b669;
}

Assistant:

errno_t
strljustify_s (char *dest, rsize_t dmax)
{
    char *orig_dest;
    rsize_t orig_dmax;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * corner case, a dmax of one allows only for a null
     */
    if (*dest == '\0' || dmax <= RSIZE_MIN_STR) {
        *dest = '\0';
        return (EOK);
    }

    orig_dmax = dmax;
    orig_dest = dest;

     /*
      * scan the string to be sure it is properly terminated
      */
     while (*dest) {
        if (dmax == 0) {
            while (orig_dmax) { *orig_dest++ = '\0';  orig_dmax--; }

            invoke_safe_str_constraint_handler(
                      "strljustify_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (ESUNTERM);
        }
        dmax--;
        dest++;
    }

    /*
     * find first non-white space char
     */
    dest = orig_dest;
    while ((*dest == ' ') || (*dest == '\t')) {
        dest++;
    }

   /*
    * shift text, removing spaces, to left justify
    */
    if (orig_dest != dest && *dest) {
        while (*dest) {
            *orig_dest++ = *dest;
            *dest++ = ' ';
        }
        *orig_dest = '\0';
    }

    return (EOK);
}